

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoMode.cpp
# Opt level: O1

vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> * sf::VideoMode::getFullscreenModes(void)

{
  long lVar1;
  pointer pVVar2;
  pointer pVVar3;
  ulong uVar4;
  pointer local_28;
  pointer pVStack_20;
  pointer local_18;
  
  if (getFullscreenModes()::modes == '\0') {
    getFullscreenModes();
  }
  if (getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    priv::VideoModeImpl::getFullscreenModes();
    pVVar2 = getFullscreenModes::modes.
             super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>._M_impl.
             super__Vector_impl_data._M_start;
    getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
    _M_impl.super__Vector_impl_data._M_start = local_28;
    getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVStack_20;
    getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_18;
    if (pVVar2 != (pointer)0x0) {
      operator_delete(pVVar2);
    }
    pVVar3 = getFullscreenModes::modes.
             super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pVVar2 = getFullscreenModes::modes.
             super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        getFullscreenModes::modes.super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      uVar4 = ((long)getFullscreenModes::modes.
                     super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)getFullscreenModes::modes.
                     super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<sf::VideoMode*,std::vector<sf::VideoMode,std::allocator<sf::VideoMode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<sf::VideoMode>>>
                (getFullscreenModes::modes.
                 super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 getFullscreenModes::modes.
                 super__Vector_base<sf::VideoMode,_std::allocator<sf::VideoMode>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<sf::VideoMode*,std::vector<sf::VideoMode,std::allocator<sf::VideoMode>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<sf::VideoMode>>>
                (pVVar2,pVVar3);
    }
  }
  return &getFullscreenModes::modes;
}

Assistant:

const std::vector<VideoMode>& VideoMode::getFullscreenModes()
{
    static std::vector<VideoMode> modes;

    // Populate the array on first call
    if (modes.empty())
    {
        modes = priv::VideoModeImpl::getFullscreenModes();
        std::sort(modes.begin(), modes.end(), std::greater<VideoMode>());
    }

    return modes;
}